

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_Double_Test::Body(iu_AssertionTest_x_iutest_x_Double_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_5d8;
  Fixed local_5a8;
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c8;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  double d1;
  double d0;
  iu_AssertionTest_x_iutest_x_Double_Test *this_local;
  
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0x3ff00000000000;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperFloatingPointEQ<double>
            ((AssertionResult *)local_48,"1.0","d1",1.0,(double)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xcd,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<double>
              ((AssertionResult *)local_240,"0.0","d0",0.0,0.0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xce,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<double>
              ((AssertionResult *)local_420,"-1.0","-2.0/2.0",-1.0,-1.0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      memset(&local_5a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_420);
      iutest::AssertionHelper::AssertionHelper
                (&local_5d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xcf,pcVar2,kWarning);
      iutest::AssertionHelper::operator=(&local_5d8,&local_5a8);
      iutest::AssertionHelper::~AssertionHelper(&local_5d8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, Double)
{
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_DOUBLE_EQ(1.0, d1);
    IUTEST_EXPECT_DOUBLE_EQ(0.0, d0);
    IUTEST_INFORM_DOUBLE_EQ(-1.0, -2.0/2.0);
}